

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O1

function<void_(BaseSocket_*,_void_*)> * __thiscall
BaseSocket::BindErrorFunction
          (function<void_(BaseSocket_*,_void_*)> *__return_storage_ptr__,BaseSocket *this,
          function<void_(BaseSocket_*,_void_*)> *fError)

{
  BaseSocketImpl *pBVar1;
  _Any_data _Stack_38;
  code *local_28;
  
  pBVar1 = (this->Impl_)._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  std::function<void_(BaseSocket_*,_void_*)>::function
            ((function<void_(BaseSocket_*,_void_*)> *)&_Stack_38,fError);
  (*pBVar1->_vptr_BaseSocketImpl[4])(__return_storage_ptr__,pBVar1,&_Stack_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<void(BaseSocket*, void*)> BaseSocket::BindErrorFunction(std::function<void(BaseSocket*, void*)> fError)
{
    return GetImpl()->BindErrorFunction(fError);
}